

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall Chainstate::ReplayBlocks(Chainstate *this)

{
  int height;
  int *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  uchar *puVar2;
  long lVar3;
  CoinsViews *baseIn;
  Notifications *pNVar4;
  uint256 *puVar5;
  int iVar6;
  bool bVar7;
  DisconnectResult DVar8;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar9;
  size_type sVar10;
  mapped_type *pb;
  pointer puVar11;
  mapped_type *pa;
  CBlockIndex *pCVar12;
  char *fmt;
  CBlockIndex **ppCVar13;
  int iVar14;
  pointer puVar15;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  vector<uint256,_std::allocator<uint256>_> hashHeads;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  string local_298;
  CBlock block;
  CCoinsViewCache cache;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock36.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock36.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock36.super_unique_lock);
  puVar9 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                     (&this->m_coins_views,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                      ,0x271,"CoinsDB","m_coins_views");
  baseIn = (puVar9->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
           super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
           super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
  CCoinsViewCache::CCoinsViewCache(&cache,(CCoinsView *)baseIn,false);
  (*(baseIn->m_dbview).super_CCoinsView._vptr_CCoinsView[3])(&hashHeads,baseIn);
  if (hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start ==
      hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar7 = true;
    goto LAB_00aff58d;
  }
  if ((long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start == 0x40) {
    pNVar4 = (this->m_chainman->m_options).notifications;
    block.super_CBlockHeader._0_8_ =
         block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&block,anon_var_dwarf_3f4ef23,anon_var_dwarf_3f4ef23 + 0x13);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c);
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      block.super_CBlockHeader._32_8_ =
           block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)pbVar1,anon_var_dwarf_3f4ef23,anon_var_dwarf_3f4ef23 + 0x13);
    }
    else {
      local_298._M_dataplus._M_p = anon_var_dwarf_3f4ef23;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (pbVar1,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_298);
    }
    (*pNVar4->_vptr_Notifications[4])(pNVar4,&block,0,0);
    if ((uchar *)block.super_CBlockHeader._32_8_ !=
        block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) {
      operator_delete((void *)block.super_CBlockHeader._32_8_,
                      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems.
                      _12_8_ + 1);
    }
    if ((uchar *)block.super_CBlockHeader._0_8_ !=
        block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
      operator_delete((void *)block.super_CBlockHeader._0_8_,
                      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                      _12_8_ + 1);
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "ReplayBlocks";
    logging_function_00._M_len = 0xc;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x1300,ALL,Info,
               (ConstevalFormatString<0U>)0xfd51ba);
    sVar10 = std::
             _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::count(&(this->m_blockman->m_block_index)._M_h,
                     hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start);
    if (sVar10 != 0) {
      pb = std::__detail::
           _Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->m_blockman->m_block_index,
                        hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start);
      puVar15 = hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start + 2;
      puVar11 = (pointer)std::
                         __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                   (hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 1,puVar15);
      if (puVar11 == puVar15) {
        pCVar12 = (mapped_type *)0x0;
        pa = (mapped_type *)0x0;
      }
      else {
        sVar10 = std::
                 _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count(&(this->m_blockman->m_block_index)._M_h,
                         hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
        if (sVar10 == 0) {
          fmt = "ReplayBlocks(): reorganization from unknown block requested\n";
          iVar14 = 0x130e;
          goto LAB_00aff145;
        }
        pa = std::__detail::
             _Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_blockman->m_block_index,
                          hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
        pCVar12 = LastCommonAncestor(pa,pb);
        if (pCVar12 == (CBlockIndex *)0x0) {
          __assert_fail("pindexFork != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1313,"bool Chainstate::ReplayBlocks()");
        }
      }
      if (pa != pCVar12) {
        do {
          if (0 < pa->nHeight) {
            block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            block.super_CBlockHeader.nBits = 0;
            block.super_CBlockHeader.nNonce = 0;
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 '\0';
            block.super_CBlockHeader.nTime = 0;
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0'
            ;
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0'
            ;
            block.super_CBlockHeader.nVersion = 0;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            block.fChecked = false;
            block.m_checked_witness_commitment = false;
            block.m_checked_merkle_root = false;
            bVar7 = ::node::BlockManager::ReadBlockFromDisk(this->m_blockman,&block,pa);
            args = &pa->nHeight;
            if (bVar7) {
              puVar5 = pa->phashBlock;
              if (puVar5 == (uint256 *)0x0) goto LAB_00aff65c;
              local_2b8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
              uStack_2b0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
              local_2a8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
              uStack_2a0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
              base_blob<256u>::ToString_abi_cxx11_(&local_298,&local_2b8);
              source_file_01._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_01._M_len = 0x5e;
              logging_function_01._M_str = "ReplayBlocks";
              logging_function_01._M_len = 0xc;
              LogPrintFormatInternal<std::__cxx11::string,int>
                        (logging_function_01,source_file_01,0x131e,ALL,Info,
                         (ConstevalFormatString<2U>)0xfd52b6,&local_298,args);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p,
                                local_298.field_2._M_allocated_capacity + 1);
              }
              DVar8 = DisconnectBlock(this,&block,pa,&cache);
              if (DVar8 != DISCONNECT_FAILED) {
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::~vector(&block.vtx);
                goto LAB_00aff11b;
              }
              puVar5 = pa->phashBlock;
              if (puVar5 == (uint256 *)0x0) goto LAB_00aff65c;
              local_2b8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
              uStack_2b0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
              local_2a8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
              uStack_2a0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
              base_blob<256u>::ToString_abi_cxx11_(&local_298,&local_2b8);
              source_file_05._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_05._M_len = 0x5e;
              logging_function_05._M_str = "ReplayBlocks";
              logging_function_05._M_len = 0xc;
              LogPrintFormatInternal<int,std::__cxx11::string>
                        (logging_function_05,source_file_05,0x1321,ALL,Error,
                         (ConstevalFormatString<2U>)0xfd52cc,args,&local_298);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p,
                                local_298.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              puVar5 = pa->phashBlock;
              if (puVar5 == (uint256 *)0x0) goto LAB_00aff65c;
              local_2b8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
              uStack_2b0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
              local_2a8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
              uStack_2a0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
              base_blob<256u>::ToString_abi_cxx11_(&local_298,&local_2b8);
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_04._M_len = 0x5e;
              logging_function_04._M_str = "ReplayBlocks";
              logging_function_04._M_len = 0xc;
              LogPrintFormatInternal<int,std::__cxx11::string>
                        (logging_function_04,source_file_04,0x131b,ALL,Error,
                         (ConstevalFormatString<2U>)0xfd527a,args,&local_298);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p,
                                local_298.field_2._M_allocated_capacity + 1);
              }
            }
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector(&block.vtx);
            goto LAB_00aff58a;
          }
LAB_00aff11b:
          pa = pa->pprev;
        } while (pa != pCVar12);
      }
      if (pCVar12 == (mapped_type *)0x0) {
        iVar14 = 0;
      }
      else {
        iVar14 = pCVar12->nHeight;
      }
      height = iVar14 + 1;
      local_2b8 = CONCAT44(local_2b8._4_4_,height);
      bVar7 = pb->nHeight <= iVar14;
      if (iVar14 < pb->nHeight) {
        do {
          block.super_CBlockHeader._0_8_ = CBlockIndex::GetAncestor(pb,height);
          ppCVar13 = inline_assertion_check<true,CBlockIndex_const*>
                               ((CBlockIndex **)&block,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0x132f,"ReplayBlocks","pindexNew->GetAncestor(nHeight)");
          pCVar12 = *ppCVar13;
          puVar5 = pCVar12->phashBlock;
          if (puVar5 == (uint256 *)0x0) goto LAB_00aff65c;
          local_298._M_dataplus._M_p = *(pointer *)(puVar5->super_base_blob<256U>).m_data._M_elems;
          local_298._M_string_length =
               *(size_type *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
          local_298.field_2._M_allocated_capacity =
               *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
          local_298.field_2._8_8_ =
               *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
          base_blob<256u>::ToString_abi_cxx11_((string *)&block,&local_298);
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_03._M_len = 0x5e;
          logging_function_03._M_str = "ReplayBlocks";
          logging_function_03._M_len = 0xc;
          LogPrintFormatInternal<std::__cxx11::string,int>
                    (logging_function_03,source_file_03,0x1331,ALL,Info,
                     (ConstevalFormatString<2U>)0xfd5324,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block,
                     (int *)&local_2b8);
          if ((uchar *)block.super_CBlockHeader._0_8_ !=
              block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
            operator_delete((void *)block.super_CBlockHeader._0_8_,
                            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems._12_8_ + 1);
          }
          pNVar4 = (this->m_chainman->m_options).notifications;
          block.super_CBlockHeader._0_8_ =
               block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&block,anon_var_dwarf_3f4ef23,anon_var_dwarf_3f4ef23 + 0x13);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            block.super_CBlockHeader._32_8_ =
                 block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc
            ;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                       + 0x1c),anon_var_dwarf_3f4ef23,anon_var_dwarf_3f4ef23 + 0x13);
          }
          else {
            local_298._M_dataplus._M_p = anon_var_dwarf_3f4ef23;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                       + 0x1c),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_298);
          }
          (*pNVar4->_vptr_Notifications[4])
                    (pNVar4,&block,
                     (ulong)(uint)(int)(((double)((int)local_2b8 - iVar14) * 100.0) /
                                       (double)(pb->nHeight - iVar14)),0);
          if ((uchar *)block.super_CBlockHeader._32_8_ !=
              block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) {
            operator_delete((void *)block.super_CBlockHeader._32_8_,
                            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data.
                            _M_elems._12_8_ + 1);
          }
          if ((uchar *)block.super_CBlockHeader._0_8_ !=
              block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
            operator_delete((void *)block.super_CBlockHeader._0_8_,
                            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems._12_8_ + 1);
          }
          bVar7 = RollforwardBlock(this,pCVar12,&cache);
          if (!bVar7) goto LAB_00aff58a;
          iVar6 = (int)local_2b8;
          height = (int)local_2b8 + 1;
          local_2b8 = CONCAT44(local_2b8._4_4_,height);
          bVar7 = pb->nHeight <= iVar6;
        } while (iVar6 < pb->nHeight);
      }
      puVar5 = pb->phashBlock;
      if (puVar5 == (uint256 *)0x0) {
LAB_00aff65c:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      block.super_CBlockHeader._0_8_ =
           *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
           *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
           *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
           *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
      CCoinsViewCache::SetBestBlock(&cache,(uint256 *)&block);
      CCoinsViewCache::Flush(&cache);
      pNVar4 = (this->m_chainman->m_options).notifications;
      block.super_CBlockHeader._0_8_ =
           block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
           block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ &
           0xffffffffffffff00;
      puVar2 = block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc;
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_8_ =
           block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_8_ &
           0xffffffffffffff00;
      block.super_CBlockHeader._32_8_ = puVar2;
      (*pNVar4->_vptr_Notifications[4])(pNVar4,&block,100,0);
      if ((uchar *)block.super_CBlockHeader._32_8_ != puVar2) {
        operator_delete((void *)block.super_CBlockHeader._32_8_,
                        block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data.
                        _M_elems._12_8_ + 1);
      }
      if ((uchar *)block.super_CBlockHeader._0_8_ !=
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
        operator_delete((void *)block.super_CBlockHeader._0_8_,
                        block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                        ._12_8_ + 1);
      }
      goto LAB_00aff58d;
    }
    fmt = "ReplayBlocks(): reorganization to unknown block requested\n";
    iVar14 = 0x1307;
LAB_00aff145:
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_02._M_len = 0x5e;
    logging_function_02._M_str = "ReplayBlocks";
    logging_function_02._M_len = 0xc;
    LogPrintFormatInternal<>
              (logging_function_02,source_file_02,iVar14,ALL,Error,(ConstevalFormatString<0U>)fmt);
  }
  else {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "ReplayBlocks";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x12fb,ALL,Error,(ConstevalFormatString<0U>)0xfd517a);
  }
LAB_00aff58a:
  bVar7 = false;
LAB_00aff58d:
  if (hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cache.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&cache.cacheCoins._M_h);
  if (cache.m_sentinel.second.m_flags != '\0') {
    ((cache.m_sentinel.second.m_next)->second).m_prev = cache.m_sentinel.second.m_prev;
    ((cache.m_sentinel.second.m_prev)->second).m_next = cache.m_sentinel.second.m_next;
    cache.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < cache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(cache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
         indirect);
    cache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
    indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource(&cache.m_cache_coins_memory_resource);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock36.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ReplayBlocks()
{
    LOCK(cs_main);

    CCoinsView& db = this->CoinsDB();
    CCoinsViewCache cache(&db);

    std::vector<uint256> hashHeads = db.GetHeadBlocks();
    if (hashHeads.empty()) return true; // We're already in a consistent state.
    if (hashHeads.size() != 2) {
        LogError("ReplayBlocks(): unknown inconsistent state\n");
        return false;
    }

    m_chainman.GetNotifications().progress(_("Replaying blocks…"), 0, false);
    LogPrintf("Replaying blocks\n");

    const CBlockIndex* pindexOld = nullptr;  // Old tip during the interrupted flush.
    const CBlockIndex* pindexNew;            // New tip during the interrupted flush.
    const CBlockIndex* pindexFork = nullptr; // Latest block common to both the old and the new tip.

    if (m_blockman.m_block_index.count(hashHeads[0]) == 0) {
        LogError("ReplayBlocks(): reorganization to unknown block requested\n");
        return false;
    }
    pindexNew = &(m_blockman.m_block_index[hashHeads[0]]);

    if (!hashHeads[1].IsNull()) { // The old tip is allowed to be 0, indicating it's the first flush.
        if (m_blockman.m_block_index.count(hashHeads[1]) == 0) {
            LogError("ReplayBlocks(): reorganization from unknown block requested\n");
            return false;
        }
        pindexOld = &(m_blockman.m_block_index[hashHeads[1]]);
        pindexFork = LastCommonAncestor(pindexOld, pindexNew);
        assert(pindexFork != nullptr);
    }

    // Rollback along the old branch.
    while (pindexOld != pindexFork) {
        if (pindexOld->nHeight > 0) { // Never disconnect the genesis block.
            CBlock block;
            if (!m_blockman.ReadBlockFromDisk(block, *pindexOld)) {
                LogError("RollbackBlock(): ReadBlockFromDisk() failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            LogPrintf("Rolling back %s (%i)\n", pindexOld->GetBlockHash().ToString(), pindexOld->nHeight);
            DisconnectResult res = DisconnectBlock(block, pindexOld, cache);
            if (res == DISCONNECT_FAILED) {
                LogError("RollbackBlock(): DisconnectBlock failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            // If DISCONNECT_UNCLEAN is returned, it means a non-existing UTXO was deleted, or an existing UTXO was
            // overwritten. It corresponds to cases where the block-to-be-disconnect never had all its operations
            // applied to the UTXO set. However, as both writing a UTXO and deleting a UTXO are idempotent operations,
            // the result is still a version of the UTXO set with the effects of that block undone.
        }
        pindexOld = pindexOld->pprev;
    }

    // Roll forward from the forking point to the new tip.
    int nForkHeight = pindexFork ? pindexFork->nHeight : 0;
    for (int nHeight = nForkHeight + 1; nHeight <= pindexNew->nHeight; ++nHeight) {
        const CBlockIndex& pindex{*Assert(pindexNew->GetAncestor(nHeight))};

        LogPrintf("Rolling forward %s (%i)\n", pindex.GetBlockHash().ToString(), nHeight);
        m_chainman.GetNotifications().progress(_("Replaying blocks…"), (int)((nHeight - nForkHeight) * 100.0 / (pindexNew->nHeight - nForkHeight)), false);
        if (!RollforwardBlock(&pindex, cache)) return false;
    }

    cache.SetBestBlock(pindexNew->GetBlockHash());
    cache.Flush();
    m_chainman.GetNotifications().progress(bilingual_str{}, 100, false);
    return true;
}